

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mux.c
# Opt level: O1

int envy_bios_parse_mux(envy_bios *bios)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  envy_bios_mux_entry *peVar7;
  undefined8 uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  char *__format;
  long lVar13;
  envy_bios_mux_entry *peVar14;
  uint8_t sub [4];
  byte abStack_3c [4];
  long local_38;
  
  uVar2 = (bios->mux).offset;
  iVar11 = 0;
  if (uVar2 != 0) {
    if ((uint)uVar2 < bios->length) {
      (bios->mux).version = bios->data[(uint)uVar2];
      iVar11 = 0;
    }
    else {
      (bios->mux).version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar11 = -0xe;
    }
    lVar9 = (ulong)(bios->mux).offset + 1;
    if ((uint)lVar9 < bios->length) {
      (bios->mux).hlen = bios->data[lVar9];
      iVar10 = 0;
    }
    else {
      (bios->mux).hlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar10 = -0xe;
    }
    lVar9 = (ulong)(bios->mux).offset + 2;
    if ((uint)lVar9 < bios->length) {
      (bios->mux).entriesnum = bios->data[lVar9];
      iVar3 = 0;
    }
    else {
      (bios->mux).entriesnum = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar3 = -0xe;
    }
    lVar9 = (ulong)(bios->mux).offset + 3;
    if ((uint)lVar9 < bios->length) {
      (bios->mux).rlen = bios->data[lVar9];
      iVar4 = 0;
    }
    else {
      (bios->mux).rlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar4 = -0xe;
    }
    if (((iVar10 == 0 && iVar11 == 0) && iVar3 == 0) && iVar4 == 0) {
      envy_bios_block(bios,(uint)(bios->mux).offset,
                      (uint)(bios->mux).entriesnum * (uint)(bios->mux).rlen + (uint)(bios->mux).hlen
                      ,"MUX",-1);
      if ((bios->mux).version == '\x10') {
        bVar1 = (bios->mux).hlen;
        uVar12 = (ulong)bVar1;
        if (bVar1 < 4) {
          __format = "MUX table header too short [%d < %d]\n";
          uVar8 = 4;
        }
        else {
          uVar5 = (uint)(bios->mux).rlen;
          if (4 < uVar5) {
            if (bVar1 != 4) {
              fprintf(_stderr,"MUX table header longer than expected [%d > %d]\n",uVar12,4);
            }
            bVar1 = (bios->mux).rlen;
            if (5 < bVar1) {
              fprintf(_stderr,"MUX table record longer than expected [%d > %d]\n",(ulong)bVar1,5);
            }
            peVar7 = (envy_bios_mux_entry *)calloc((ulong)(bios->mux).entriesnum,0x14);
            (bios->mux).entries = peVar7;
            if (peVar7 == (envy_bios_mux_entry *)0x0) {
              return -0xc;
            }
            if ((bios->mux).entriesnum != '\0') {
              lVar9 = 0xf;
              uVar12 = 0;
              do {
                peVar7 = (bios->mux).entries;
                peVar14 = peVar7 + uVar12;
                uVar5 = (uint)(bios->mux).rlen * (int)uVar12 +
                        (uint)(bios->mux).hlen + (uint)(bios->mux).offset;
                peVar14->offset = (uint16_t)uVar5;
                uVar5 = uVar5 & 0xffff;
                if (uVar5 < bios->length) {
                  peVar14->idx = bios->data[uVar5];
                  uVar5 = 0;
                }
                else {
                  peVar14->idx = '\0';
                  fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                  uVar5 = 0xfffffff2;
                }
                lVar13 = 0;
                local_38 = lVar9;
                do {
                  if ((int)lVar13 + (uint)peVar14->offset + 1 < bios->length) {
                    abStack_3c[lVar13] = bios->data[lVar13 + 1 + (ulong)peVar14->offset];
                    uVar6 = 0;
                  }
                  else {
                    abStack_3c[lVar13] = 0;
                    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                    uVar6 = 0xfffffff2;
                  }
                  uVar5 = uVar5 | uVar6;
                  bVar1 = abStack_3c[lVar13];
                  peVar7->sub_loc[lVar13 + lVar9 + -0xf] = bVar1 & 1;
                  peVar7->sub_loc[lVar13 + lVar9 + -0xb] = bVar1 >> 1 & 0x1f;
                  peVar7->sub_loc[lVar13 + lVar9 + -7] = bVar1 >> 6 & 1;
                  peVar7->sub_loc[lVar13 + lVar9 + -3] = bVar1 >> 7;
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 4);
                if (uVar5 != 0) goto LAB_0025c7c6;
                uVar12 = uVar12 + 1;
                lVar9 = local_38 + 0x14;
              } while (uVar12 < (bios->mux).entriesnum);
            }
            (bios->mux).valid = '\x01';
            return 0;
          }
          __format = "MUX table record too short [%d < %d]\n";
          uVar12 = (ulong)uVar5;
          uVar8 = 5;
        }
        fprintf(_stderr,__format,uVar12,uVar8);
      }
      else {
        envy_bios_parse_mux_cold_1();
      }
      iVar11 = -0x16;
    }
    else {
LAB_0025c7c6:
      iVar11 = -0xe;
    }
  }
  return iVar11;
}

Assistant:

int envy_bios_parse_mux (struct envy_bios *bios) {
	struct envy_bios_mux *mux = &bios->mux;
	if (!mux->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, mux->offset, &mux->version);
	err |= bios_u8(bios, mux->offset+1, &mux->hlen);
	err |= bios_u8(bios, mux->offset+2, &mux->entriesnum);
	err |= bios_u8(bios, mux->offset+3, &mux->rlen);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, mux->offset, mux->hlen + mux->rlen * mux->entriesnum, "MUX", -1);
	int wanthlen = 0;
	int wantrlen = 0;
	switch (mux->version) {
		case 0x10:
			wanthlen = 4;
			wantrlen = 5;
			break;
		default:
			ENVY_BIOS_ERR("Unknown MUX table version %d.%d\n", mux->version >> 4, mux->version & 0xf);
			return -EINVAL;
	}
	if (mux->hlen < wanthlen) {
		ENVY_BIOS_ERR("MUX table header too short [%d < %d]\n", mux->hlen, wanthlen);
		return -EINVAL;
	}
	if (mux->rlen < wantrlen) {
		ENVY_BIOS_ERR("MUX table record too short [%d < %d]\n", mux->rlen, wantrlen);
		return -EINVAL;
	}
	if (mux->hlen > wanthlen) {
		ENVY_BIOS_WARN("MUX table header longer than expected [%d > %d]\n", mux->hlen, wanthlen);
	}
	if (mux->rlen > wantrlen) {
		ENVY_BIOS_WARN("MUX table record longer than expected [%d > %d]\n", mux->rlen, wantrlen);
	}
	mux->entries = calloc(mux->entriesnum, sizeof *mux->entries);
	if (!mux->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < mux->entriesnum; i++) {
		struct envy_bios_mux_entry *entry = &mux->entries[i];
		entry->offset = mux->offset + mux->hlen + mux->rlen * i;
		uint8_t sub[4];
		err |= bios_u8(bios, entry->offset, &entry->idx);
		int j;
		for (j = 0; j < 4; j++) {
			err |= bios_u8(bios, entry->offset+j+1, &sub[j]);
			entry->sub_loc[j] = sub[j] & 1;
			entry->sub_line[j] = sub[j] >> 1 & 0x1f;
			entry->sub_val[j] = sub[j] >> 6 & 1;
			entry->sub_unk7[j] = sub[j] >> 7 & 1;
		}
		if (err)
			return -EFAULT;
	}
	mux->valid = 1;
	return 0;
}